

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcontainertools_impl.h
# Opt level: O3

void QtPrivate::q_relocate_overlap_n_left_move<std::reverse_iterator<QKmsPlane*>,long_long>
               (reverse_iterator<QKmsPlane_*> first,longlong n,reverse_iterator<QKmsPlane_*> d_first
               )

{
  Data *pDVar1;
  uint *puVar2;
  qsizetype qVar3;
  QKmsPlane *pQVar4;
  Type TVar5;
  Rotations RVar6;
  uint32_t uVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  uint32_t uVar17;
  uint32_t uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  QKmsPlane *pQVar21;
  QKmsPlane *pQVar22;
  QKmsPlane *pQVar23;
  QKmsPlane *pQVar24;
  long in_FS_OFFSET;
  Destructor local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_50.iter = &local_50.intermediate;
  local_50.end.current = *d_first.current;
  pQVar23 = local_50.end.current + -n;
  pQVar22 = *first.current;
  pQVar21 = local_50.end.current;
  pQVar4 = pQVar23;
  pQVar24 = pQVar22;
  if (pQVar23 < pQVar22) {
    pQVar4 = pQVar22;
    pQVar24 = pQVar23;
  }
  while (local_50.intermediate.current = pQVar21, pQVar21 != pQVar4) {
    pQVar21[-1].possibleCrtcs = pQVar22[-1].possibleCrtcs;
    TVar5 = pQVar22[-1].type;
    pQVar21[-1].id = pQVar22[-1].id;
    pQVar21[-1].type = TVar5;
    pDVar1 = pQVar22[-1].supportedFormats.d.d;
    pQVar22[-1].supportedFormats.d.d = (Data *)0x0;
    pQVar21[-1].supportedFormats.d.d = pDVar1;
    puVar2 = pQVar22[-1].supportedFormats.d.ptr;
    pQVar22[-1].supportedFormats.d.ptr = (uint *)0x0;
    pQVar21[-1].supportedFormats.d.ptr = puVar2;
    qVar3 = pQVar22[-1].supportedFormats.d.size;
    pQVar22[-1].supportedFormats.d.size = 0;
    pQVar21[-1].supportedFormats.d.size = qVar3;
    RVar6.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.super_QFlagsStorage<QKmsPlane::Rotation>
    .i = pQVar22[-1].availableRotations.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
    uVar7 = pQVar22[-1].rotationPropertyId;
    uVar8 = pQVar22[-1].crtcPropertyId;
    uVar9 = pQVar22[-1].framebufferPropertyId;
    uVar10 = pQVar22[-1].srcXPropertyId;
    uVar11 = pQVar22[-1].srcYPropertyId;
    uVar12 = pQVar22[-1].crtcXPropertyId;
    uVar13 = pQVar22[-1].crtcYPropertyId;
    uVar14 = pQVar22[-1].srcwidthPropertyId;
    uVar15 = pQVar22[-1].srcheightPropertyId;
    uVar16 = pQVar22[-1].crtcwidthPropertyId;
    uVar17 = pQVar22[-1].crtcheightPropertyId;
    uVar18 = pQVar22[-1].zposPropertyId;
    uVar19 = pQVar22[-1].blendOpPropertyId;
    uVar20 = pQVar22[-1].activeCrtcId;
    pQVar21[-1].initialRotation =
         (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)
         pQVar22[-1].initialRotation.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
    pQVar21[-1].availableRotations =
         (Rotations)
         RVar6.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
         super_QFlagsStorage<QKmsPlane::Rotation>.i;
    pQVar21[-1].rotationPropertyId = uVar7;
    pQVar21[-1].crtcPropertyId = uVar8;
    pQVar21[-1].framebufferPropertyId = uVar9;
    pQVar21[-1].srcXPropertyId = uVar10;
    pQVar21[-1].srcYPropertyId = uVar11;
    pQVar21[-1].crtcXPropertyId = uVar12;
    pQVar21[-1].crtcYPropertyId = uVar13;
    pQVar21[-1].srcwidthPropertyId = uVar14;
    pQVar21[-1].srcheightPropertyId = uVar15;
    pQVar21[-1].crtcwidthPropertyId = uVar16;
    pQVar21[-1].crtcheightPropertyId = uVar17;
    pQVar21[-1].zposPropertyId = uVar18;
    pQVar21[-1].blendOpPropertyId = uVar19;
    pQVar21[-1].activeCrtcId = uVar20;
    *(long *)d_first.current = *(long *)d_first.current + -0x68;
    pQVar22 = (QKmsPlane *)(*(long *)first.current - 0x68);
    *(QKmsPlane **)first.current = pQVar22;
    pQVar21 = *d_first.current;
  }
  while (pQVar21 != pQVar23) {
    pQVar21[-1].possibleCrtcs = pQVar22[-1].possibleCrtcs;
    TVar5 = pQVar22[-1].type;
    pQVar21[-1].id = pQVar22[-1].id;
    pQVar21[-1].type = TVar5;
    QArrayDataPointer<unsigned_int>::operator=
              (&pQVar21[-1].supportedFormats.d,&pQVar22[-1].supportedFormats.d);
    RVar6.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.super_QFlagsStorage<QKmsPlane::Rotation>
    .i = pQVar22[-1].availableRotations.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
    uVar7 = pQVar22[-1].rotationPropertyId;
    uVar8 = pQVar22[-1].crtcPropertyId;
    uVar9 = pQVar22[-1].framebufferPropertyId;
    uVar10 = pQVar22[-1].srcXPropertyId;
    uVar11 = pQVar22[-1].srcYPropertyId;
    uVar12 = pQVar22[-1].crtcXPropertyId;
    uVar13 = pQVar22[-1].crtcYPropertyId;
    uVar14 = pQVar22[-1].srcwidthPropertyId;
    uVar15 = pQVar22[-1].srcheightPropertyId;
    uVar16 = pQVar22[-1].crtcwidthPropertyId;
    uVar17 = pQVar22[-1].crtcheightPropertyId;
    uVar18 = pQVar22[-1].zposPropertyId;
    uVar19 = pQVar22[-1].blendOpPropertyId;
    uVar20 = pQVar22[-1].activeCrtcId;
    pQVar21[-1].initialRotation =
         (QFlagsStorageHelper<QKmsPlane::Rotation,_4>)
         pQVar22[-1].initialRotation.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>;
    pQVar21[-1].availableRotations =
         (Rotations)
         RVar6.super_QFlagsStorageHelper<QKmsPlane::Rotation,_4>.
         super_QFlagsStorage<QKmsPlane::Rotation>.i;
    pQVar21[-1].rotationPropertyId = uVar7;
    pQVar21[-1].crtcPropertyId = uVar8;
    pQVar21[-1].framebufferPropertyId = uVar9;
    pQVar21[-1].srcXPropertyId = uVar10;
    pQVar21[-1].srcYPropertyId = uVar11;
    pQVar21[-1].crtcXPropertyId = uVar12;
    pQVar21[-1].crtcYPropertyId = uVar13;
    pQVar21[-1].srcwidthPropertyId = uVar14;
    pQVar21[-1].srcheightPropertyId = uVar15;
    pQVar21[-1].crtcwidthPropertyId = uVar16;
    pQVar21[-1].crtcheightPropertyId = uVar17;
    pQVar21[-1].zposPropertyId = uVar18;
    pQVar21[-1].blendOpPropertyId = uVar19;
    pQVar21[-1].activeCrtcId = uVar20;
    *(long *)d_first.current = *(long *)d_first.current + -0x68;
    pQVar22 = (QKmsPlane *)(*(long *)first.current - 0x68);
    *(QKmsPlane **)first.current = pQVar22;
    pQVar21 = *d_first.current;
  }
  local_50.iter = &local_50.end;
  while (pQVar22 != pQVar24) {
    *(QKmsPlane **)first.current = pQVar22 + 1;
    pDVar1 = (pQVar22->supportedFormats).d.d;
    if (pDVar1 != (Data *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&((pQVar22->supportedFormats).d.d)->super_QArrayData,4,0x10);
      }
    }
    pQVar22 = *first.current;
  }
  q_relocate_overlap_n_left_move<std::reverse_iterator<QKmsPlane_*>,_long_long>::Destructor::
  ~Destructor(&local_50);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void q_relocate_overlap_n_left_move(iterator first, N n, iterator d_first)
{
    // requires: [first, n) is a valid range
    // requires: d_first + n is reachable from d_first
    // requires: iterator is at least a random access iterator
    // requires: value_type(iterator) has a non-throwing destructor

    Q_ASSERT(n);
    Q_ASSERT(d_first < first); // only allow moves to the "left"
    using T = typename std::iterator_traits<iterator>::value_type;

    // Watches passed iterator. Unless commit() is called, all the elements that
    // the watched iterator passes through are deleted at the end of object
    // lifetime. freeze() could be used to stop watching the passed iterator and
    // remain at current place.
    //
    // requires: the iterator is expected to always point to an invalid object
    //           (to uninitialized memory)
    struct Destructor
    {
        iterator *iter;
        iterator end;
        iterator intermediate;

        Destructor(iterator &it) noexcept : iter(std::addressof(it)), end(it) { }
        void commit() noexcept { iter = std::addressof(end); }
        void freeze() noexcept
        {
            intermediate = *iter;
            iter = std::addressof(intermediate);
        }
        ~Destructor() noexcept
        {
            for (const int step = *iter < end ? 1 : -1; *iter != end;) {
                std::advance(*iter, step);
                (*iter)->~T();
            }
        }
    } destroyer(d_first);

    const iterator d_last = d_first + n;
    // Note: use pair and explicitly copy iterators from it to prevent
    // accidental reference semantics instead of copy. equivalent to:
    //
    // auto [overlapBegin, overlapEnd] = std::minmax(d_last, first);
    auto pair = std::minmax(d_last, first);

    // overlap area between [d_first, d_first + n) and [first, first + n) or an
    // uninitialized memory area between the two ranges
    iterator overlapBegin = pair.first;
    iterator overlapEnd = pair.second;

    // move construct elements in uninitialized region
    while (d_first != overlapBegin) {
        // account for std::reverse_iterator, cannot use new(d_first) directly
        new (std::addressof(*d_first)) T(std::move_if_noexcept(*first));
        ++d_first;
        ++first;
    }

    // cannot commit but have to stop - there might be an overlap region
    // which we don't want to delete (because it's part of existing data)
    destroyer.freeze();

    // move assign elements in overlap region
    while (d_first != d_last) {
        *d_first = std::move_if_noexcept(*first);
        ++d_first;
        ++first;
    }

    Q_ASSERT(d_first == destroyer.end + n);
    destroyer.commit(); // can commit here as ~T() below does not throw

    while (first != overlapEnd)
        (--first)->~T();
}